

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VConstVectorArray(int nvec,realtype c,N_Vector *Z)

{
  _func_int_int_realtype_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvconstvectorarray;
  if (UNRECOVERED_JUMPTABLE == (_func_int_int_realtype_N_Vector_ptr *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      (*(*Z)->ops->nvconst)(c,Z[uVar3]);
    }
    return 0;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,Z);
  return iVar1;
}

Assistant:

int N_VConstVectorArray(int nvec, realtype c, N_Vector* Z)
{
  int i, ier;

  if (Z[0]->ops->nvconstvectorarray != NULL) {
    
    ier = Z[0]->ops->nvconstvectorarray(nvec, c, Z);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvconst(c, Z[i]);
    }
    return(0);

  }
}